

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O1

void gimage::remapImage<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *map)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < image->height) {
    lVar1 = 0;
    do {
      if (0 < image->width) {
        lVar2 = 0;
        do {
          if (0 < image->depth) {
            lVar3 = 0;
            do {
              image->img[lVar3][lVar1][lVar2] = (*map->img[lVar3])[image->img[lVar3][lVar1][lVar2]];
              lVar3 = lVar3 + 1;
            } while (lVar3 < image->depth);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < image->width);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < image->height);
  }
  return;
}

Assistant:

void remapImage(Image<T> &image, const Image<T> &map)
{
  assert(map.getWidth() >= image.absMaxValue()+1);
  assert(map.getDepth() == image.getDepth());

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        for (int d=0; d<image.getDepth(); d++)
        {
          image.set(i, k, d, map.get(static_cast<long>(image.get(i, k, d)), 0, d));
        }
      }
    }
  }
}